

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::removeNamedTarget(CommonCore *this,ActionMessage *command)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  action_t aVar1;
  BasicHandleInfo *pBVar2;
  ActionMessage *command_00;
  ActionMessage *in_RSI;
  HandleManager *in_RDI;
  ActionMessage *in_stack_00000048;
  BasicHandleInfo *ept;
  BasicHandleInfo *filt;
  BasicHandleInfo *inp;
  BasicHandleInfo *pub;
  ActionMessage *in_stack_ffffffffffffff40;
  ActionMessage *this_00;
  undefined8 in_stack_ffffffffffffff58;
  InterfaceType IVar3;
  CommonCore *in_stack_ffffffffffffff70;
  GlobalHandle hand;
  
  IVar3 = (InterfaceType)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  aVar1 = ActionMessage::action(in_RSI);
  command_00 = (ActionMessage *)(ulong)(uint)(aVar1 + 0xffffff84);
  switch(command_00) {
  case (ActionMessage *)0x0:
    ActionMessage::name((ActionMessage *)0x4addc0);
    name_00._M_str = (char *)in_stack_ffffffffffffff70;
    name_00._M_len = (size_t)command_00;
    pBVar2 = HandleManager::getInterfaceHandle(in_RDI,name_00,IVar3);
    if (pBVar2 == (BasicHandleInfo *)0x0) {
      routeMessage((CommonCore *)ept,in_stack_00000048);
    }
    else {
      ActionMessage::setAction(in_RSI,cmd_remove_publication);
      ActionMessage::setDestination(in_RSI,pBVar2->handle);
      SmallBuffer::clear(&in_RSI->payload);
      removeTargetFromInterface(in_stack_ffffffffffffff70,command_00);
      ActionMessage::setAction(in_RSI,cmd_remove_subscriber);
      ActionMessage::swapSourceDest(in_stack_ffffffffffffff40);
      removeTargetFromInterface(in_stack_ffffffffffffff70,command_00);
    }
    break;
  case (ActionMessage *)0x1:
    ActionMessage::name((ActionMessage *)0x4adec4);
    name_01._M_str = (char *)in_stack_ffffffffffffff70;
    name_01._M_len = (size_t)command_00;
    pBVar2 = HandleManager::getInterfaceHandle(in_RDI,name_01,IVar3);
    if (pBVar2 == (BasicHandleInfo *)0x0) {
      routeMessage((CommonCore *)ept,in_stack_00000048);
    }
    else {
      ActionMessage::setAction(in_RSI,cmd_remove_endpoint);
      ActionMessage::setDestination(in_RSI,pBVar2->handle);
      SmallBuffer::clear(&in_RSI->payload);
      removeTargetFromInterface(in_stack_ffffffffffffff70,command_00);
      ActionMessage::setAction(in_RSI,cmd_remove_filter);
      ActionMessage::swapSourceDest(in_stack_ffffffffffffff40);
      removeTargetFromInterface(in_stack_ffffffffffffff70,command_00);
    }
    break;
  case (ActionMessage *)0x2:
    IVar3 = (InterfaceType)((ulong)&in_RDI[3].alias_names._M_h._M_single_bucket >> 0x38);
    ActionMessage::name((ActionMessage *)0x4adcb6);
    name._M_str = (char *)in_stack_ffffffffffffff70;
    name._M_len = (size_t)command_00;
    pBVar2 = HandleManager::getInterfaceHandle(in_RDI,name,IVar3);
    if (pBVar2 == (BasicHandleInfo *)0x0) {
      routeMessage((CommonCore *)ept,in_stack_00000048);
    }
    else {
      ActionMessage::setAction(in_RSI,cmd_remove_subscriber);
      ActionMessage::setDestination(in_RSI,pBVar2->handle);
      SmallBuffer::clear(&in_RSI->payload);
      removeTargetFromInterface(in_stack_ffffffffffffff70,command_00);
      ActionMessage::setAction(in_RSI,cmd_remove_publication);
      ActionMessage::swapSourceDest(in_stack_ffffffffffffff40);
      removeTargetFromInterface(in_stack_ffffffffffffff70,command_00);
    }
    break;
  case (ActionMessage *)0x3:
    this_00 = (ActionMessage *)&in_RDI[3].alias_names._M_h._M_single_bucket;
    ActionMessage::name((ActionMessage *)0x4adfb3);
    name_02._M_str = (char *)in_stack_ffffffffffffff70;
    name_02._M_len = (size_t)command_00;
    pBVar2 = HandleManager::getInterfaceHandle(in_RDI,name_02,IVar3);
    if (pBVar2 == (BasicHandleInfo *)0x0) {
      routeMessage((CommonCore *)ept,in_stack_00000048);
    }
    else {
      ActionMessage::setAction(in_RSI,cmd_remove_filter);
      hand = pBVar2->handle;
      ActionMessage::setDestination(in_RSI,hand);
      SmallBuffer::clear(&in_RSI->payload);
      removeTargetFromInterface((CommonCore *)hand,command_00);
      ActionMessage::setAction(in_RSI,cmd_remove_endpoint);
      ActionMessage::swapSourceDest(this_00);
      removeTargetFromInterface((CommonCore *)hand,command_00);
    }
  }
  return;
}

Assistant:

void CommonCore::removeNamedTarget(ActionMessage& command)
{
    switch (command.action()) {
        case CMD_REMOVE_NAMED_PUBLICATION: {
            auto* pub = loopHandles.getInterfaceHandle(command.name(), InterfaceType::PUBLICATION);
            if (pub != nullptr) {
                command.setAction(CMD_REMOVE_SUBSCRIBER);
                command.setDestination(pub->handle);
                command.payload.clear();
                removeTargetFromInterface(command);
                command.setAction(CMD_REMOVE_PUBLICATION);
                command.swapSourceDest();
                removeTargetFromInterface(command);
            } else {
                routeMessage(std::move(command));
            }
        } break;
        case CMD_REMOVE_NAMED_INPUT: {
            auto* inp = loopHandles.getInterfaceHandle(command.name(), InterfaceType::INPUT);
            if (inp != nullptr) {
                command.setAction(CMD_REMOVE_PUBLICATION);
                command.setDestination(inp->handle);
                command.payload.clear();
                removeTargetFromInterface(command);
                command.setAction(CMD_REMOVE_SUBSCRIBER);
                command.swapSourceDest();
                removeTargetFromInterface(command);
            } else {
                routeMessage(std::move(command));
            }
        } break;
        case CMD_REMOVE_NAMED_FILTER: {
            auto* filt = loopHandles.getInterfaceHandle(command.name(), InterfaceType::FILTER);
            if (filt != nullptr) {
                command.setAction(CMD_REMOVE_ENDPOINT);
                command.setDestination(filt->handle);
                command.payload.clear();
                removeTargetFromInterface(command);
                command.setAction(CMD_REMOVE_FILTER);
                command.swapSourceDest();
                removeTargetFromInterface(command);
            } else {
                routeMessage(std::move(command));
            }
        } break;
        case CMD_REMOVE_NAMED_ENDPOINT: {
            auto* ept = loopHandles.getInterfaceHandle(command.name(), InterfaceType::ENDPOINT);
            if (ept != nullptr) {
                command.setAction(CMD_REMOVE_FILTER);
                command.setDestination(ept->handle);
                command.payload.clear();
                removeTargetFromInterface(command);
                command.setAction(CMD_REMOVE_ENDPOINT);
                command.swapSourceDest();
                removeTargetFromInterface(command);
            } else {
                routeMessage(std::move(command));
            }
        } break;
        default:
            break;
    }
}